

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphbuilderadapter.cpp
# Opt level: O3

void __thiscall YAML::GraphBuilderAdapter::DispositionNode(GraphBuilderAdapter *this,void *pNode)

{
  ContainerFrame *pCVar1;
  _Elt_pointer pCVar2;
  _Elt_pointer pCVar3;
  
  pCVar2 = (this->m_containers).c.
           super__Deque_base<YAML::GraphBuilderAdapter::ContainerFrame,_std::allocator<YAML::GraphBuilderAdapter::ContainerFrame>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pCVar2 == (this->m_containers).c.
                super__Deque_base<YAML::GraphBuilderAdapter::ContainerFrame,_std::allocator<YAML::GraphBuilderAdapter::ContainerFrame>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    this->m_pRootNode = pNode;
  }
  else {
    if (pCVar2 == (this->m_containers).c.
                  super__Deque_base<YAML::GraphBuilderAdapter::ContainerFrame,_std::allocator<YAML::GraphBuilderAdapter::ContainerFrame>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pCVar1 = (this->m_containers).c.
               super__Deque_base<YAML::GraphBuilderAdapter::ContainerFrame,_std::allocator<YAML::GraphBuilderAdapter::ContainerFrame>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
      pCVar3 = pCVar1 + 0x1f;
      pCVar2 = pCVar1 + 0x20;
    }
    else {
      pCVar3 = pCVar2 + -1;
    }
    if ((undefined4 *)pCVar2[-1].pPrevKeyNode == &ContainerFrame::sequenceMarker) {
      (**(code **)(*(long *)this->m_builder + 0x28))(this->m_builder,pCVar3->pContainer,pNode);
      return;
    }
    if (this->m_pKeyNode == (void *)0x0) {
      this->m_pKeyNode = pNode;
    }
    else {
      (**(code **)(*(long *)this->m_builder + 0x40))();
      this->m_pKeyNode = (void *)0x0;
    }
  }
  return;
}

Assistant:

void GraphBuilderAdapter::DispositionNode(void *pNode) {
  if (m_containers.empty()) {
    m_pRootNode = pNode;
    return;
  }

  void *pContainer = m_containers.top().pContainer;
  if (m_containers.top().isMap()) {
    if (m_pKeyNode) {
      m_builder.AssignInMap(pContainer, m_pKeyNode, pNode);
      m_pKeyNode = nullptr;
    } else {
      m_pKeyNode = pNode;
    }
  } else {
    m_builder.AppendToSequence(pContainer, pNode);
  }
}